

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::NavUpdateWindowingOverlay(void)

{
  bool bVar1;
  ImGuiWindow *pIVar2;
  ImGuiWindow **ppIVar3;
  char *pcVar4;
  ImVec2 *in_stack_00000038;
  char *label;
  ImGuiWindow *window;
  int n;
  ImGuiContext *g;
  ImGuiWindowFlags in_stack_00000334;
  bool *in_stack_00000338;
  char *in_stack_00000340;
  undefined7 in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff7f;
  char *in_stack_ffffffffffffff80;
  void *in_stack_ffffffffffffff88;
  char *text;
  ImVec2 *this;
  int count;
  ImVec2 *pIVar5;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  float _x;
  float in_stack_ffffffffffffffb4;
  int local_34;
  ImVec2 local_28;
  ImVec2 local_20;
  ImVec2 local_18;
  ImVec2 local_10;
  ImGuiContext *local_8;
  
  local_8 = GImGui;
  if (0.15 < GImGui->NavWindowingTimer || GImGui->NavWindowingTimer == 0.15) {
    if (GImGui->NavWindowingListWindow == (ImGuiWindow *)0x0) {
      pIVar2 = FindWindowByName(in_stack_ffffffffffffff80);
      local_8->NavWindowingListWindow = pIVar2;
    }
    this = &local_10;
    ImVec2::ImVec2(this,(local_8->IO).DisplaySize.x * 0.2,(local_8->IO).DisplaySize.y * 0.2);
    pIVar5 = &local_18;
    ImVec2::ImVec2(pIVar5,3.4028235e+38,3.4028235e+38);
    SetNextWindowSizeConstraints
              ((ImVec2 *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),pIVar5,
               (ImGuiSizeCallback)this,in_stack_ffffffffffffff88);
    _x = 0.5;
    local_20 = operator*((ImVec2 *)CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78),0.0
                        );
    pIVar5 = &local_28;
    ImVec2::ImVec2(pIVar5,_x,_x);
    SetNextWindowPos(&local_20,1,pIVar5);
    operator*((ImVec2 *)CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78),0.0);
    PushStyleVar((ImGuiStyleVar)in_stack_ffffffffffffffb4,pIVar5);
    Begin(in_stack_00000340,in_stack_00000338,in_stack_00000334);
    local_34 = (local_8->WindowsFocusOrder).Size;
    while( true ) {
      count = (int)((ulong)this >> 0x20);
      local_34 = local_34 + -1;
      if (local_34 < 0) break;
      ppIVar3 = ImVector<ImGuiWindow_*>::operator[](&local_8->WindowsFocusOrder,local_34);
      pIVar2 = *ppIVar3;
      bVar1 = IsWindowNavFocusable(pIVar2);
      if (bVar1) {
        text = pIVar2->Name;
        pcVar4 = FindRenderedTextEnd(text,(char *)0x0);
        if (text == pcVar4) {
          GetFallbackWindowNameForWindowingList
                    ((ImGuiWindow *)CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
        }
        in_stack_ffffffffffffff7f = local_8->NavWindowingTarget == pIVar2;
        ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffb0,0.0,0.0);
        Selectable((char *)window,label._7_1_,(ImGuiSelectableFlags)label,in_stack_00000038);
      }
    }
    End();
    PopStyleVar(count);
  }
  return;
}

Assistant:

void ImGui::NavUpdateWindowingOverlay()
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.NavWindowingTarget != NULL);

    if (g.NavWindowingTimer < NAV_WINDOWING_LIST_APPEAR_DELAY)
        return;

    if (g.NavWindowingListWindow == NULL)
        g.NavWindowingListWindow = FindWindowByName("###NavWindowingList");
    SetNextWindowSizeConstraints(ImVec2(g.IO.DisplaySize.x * 0.20f, g.IO.DisplaySize.y * 0.20f), ImVec2(FLT_MAX, FLT_MAX));
    SetNextWindowPos(g.IO.DisplaySize * 0.5f, ImGuiCond_Always, ImVec2(0.5f, 0.5f));
    PushStyleVar(ImGuiStyleVar_WindowPadding, g.Style.WindowPadding * 2.0f);
    Begin("###NavWindowingList", NULL, ImGuiWindowFlags_NoTitleBar | ImGuiWindowFlags_NoFocusOnAppearing | ImGuiWindowFlags_NoResize | ImGuiWindowFlags_NoMove | ImGuiWindowFlags_NoInputs | ImGuiWindowFlags_AlwaysAutoResize | ImGuiWindowFlags_NoSavedSettings);
    for (int n = g.WindowsFocusOrder.Size - 1; n >= 0; n--)
    {
        ImGuiWindow* window = g.WindowsFocusOrder[n];
        if (!IsWindowNavFocusable(window))
            continue;
        const char* label = window->Name;
        if (label == FindRenderedTextEnd(label))
            label = GetFallbackWindowNameForWindowingList(window);
        Selectable(label, g.NavWindowingTarget == window);
    }
    End();
    PopStyleVar();
}